

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

int png_gamma_threshold(png_fixed_point screen_gamma,png_fixed_point file_gamma)

{
  int iVar1;
  bool local_15;
  png_fixed_point local_14;
  png_fixed_point local_10;
  png_fixed_point gtest;
  png_fixed_point file_gamma_local;
  png_fixed_point screen_gamma_local;
  
  local_10 = file_gamma;
  gtest = screen_gamma;
  iVar1 = png_muldiv(&local_14,screen_gamma,file_gamma,100000);
  local_15 = true;
  if (iVar1 != 0) {
    iVar1 = png_gamma_significant(local_14);
    local_15 = iVar1 != 0;
  }
  return (int)local_15;
}

Assistant:

static int /* PRIVATE */
png_gamma_threshold(png_fixed_point screen_gamma, png_fixed_point file_gamma)
{
   /* PNG_GAMMA_THRESHOLD is the threshold for performing gamma
    * correction as a difference of the overall transform from 1.0
    *
    * We want to compare the threshold with s*f - 1, if we get
    * overflow here it is because of wacky gamma values so we
    * turn on processing anyway.
    */
   png_fixed_point gtest;
   return !png_muldiv(&gtest, screen_gamma, file_gamma, PNG_FP_1) ||
       png_gamma_significant(gtest);
}